

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConditionalStatements.h
# Opt level: O0

void __thiscall
slang::ast::PatternCaseStatement::visitExprs<always_ff_assignment_outside_conditional::MainVisitor&>
          (PatternCaseStatement *this,AlwaysFFVisitor *visitor)

{
  bool bVar1;
  iterator this_00;
  iterator visitor_00;
  AlwaysFFVisitor *in_RDI;
  ItemGroup *item;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::PatternCaseStatement::ItemGroup,_18446744073709551615UL> *__range3;
  Expression *in_stack_ffffffffffffffd0;
  span<const_slang::ast::PatternCaseStatement::ItemGroup,_18446744073709551615UL>
  *in_stack_ffffffffffffffd8;
  
  Expression::visit<always_ff_assignment_outside_conditional::MainVisitor&>
            (in_stack_ffffffffffffffd0,in_RDI);
  this_00 = std::span<const_slang::ast::PatternCaseStatement::ItemGroup,_18446744073709551615UL>::
            begin((span<const_slang::ast::PatternCaseStatement::ItemGroup,_18446744073709551615UL> *
                  )in_RDI);
  visitor_00 = std::span<const_slang::ast::PatternCaseStatement::ItemGroup,_18446744073709551615UL>
               ::end(in_stack_ffffffffffffffd8);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::PatternCaseStatement::ItemGroup_*,_std::span<const_slang::ast::PatternCaseStatement::ItemGroup,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::PatternCaseStatement::ItemGroup_*,_std::span<const_slang::ast::PatternCaseStatement::ItemGroup,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffffd0,
                       (__normal_iterator<const_slang::ast::PatternCaseStatement::ItemGroup_*,_std::span<const_slang::ast::PatternCaseStatement::ItemGroup,_18446744073709551615UL>_>
                        *)in_RDI);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    in_stack_ffffffffffffffd0 =
         (Expression *)
         __gnu_cxx::
         __normal_iterator<const_slang::ast::PatternCaseStatement::ItemGroup_*,_std::span<const_slang::ast::PatternCaseStatement::ItemGroup,_18446744073709551615UL>_>
         ::operator*((__normal_iterator<const_slang::ast::PatternCaseStatement::ItemGroup_*,_std::span<const_slang::ast::PatternCaseStatement::ItemGroup,_18446744073709551615UL>_>
                      *)&stack0xffffffffffffffe0);
    not_null<const_slang::ast::Pattern_*>::operator->
              ((not_null<const_slang::ast::Pattern_*> *)0x33d7b0);
    Pattern::visit<always_ff_assignment_outside_conditional::MainVisitor>
              ((Pattern *)this_00._M_current,(AlwaysFFVisitor *)visitor_00._M_current);
    if ((in_stack_ffffffffffffffd0->type).ptr != (Type *)0x0) {
      Expression::visit<always_ff_assignment_outside_conditional::MainVisitor&>
                (in_stack_ffffffffffffffd0,in_RDI);
    }
    __gnu_cxx::
    __normal_iterator<const_slang::ast::PatternCaseStatement::ItemGroup_*,_std::span<const_slang::ast::PatternCaseStatement::ItemGroup,_18446744073709551615UL>_>
    ::operator++((__normal_iterator<const_slang::ast::PatternCaseStatement::ItemGroup_*,_std::span<const_slang::ast::PatternCaseStatement::ItemGroup,_18446744073709551615UL>_>
                  *)&stack0xffffffffffffffe0);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        expr.visit(visitor);
        for (auto& item : items) {
            item.pattern->visit(visitor);
            if (item.filter)
                item.filter->visit(visitor);
        }
    }